

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O0

void pipeline_3P_SPP(size_t L,uint w)

{
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
  *object;
  Task *rhs;
  uint in_ESI;
  Executor *in_RDI;
  Task test;
  Task pipeline;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
  pl;
  size_t cnt;
  vector<int,_std::allocator<int>_> collection3;
  vector<int,_std::allocator<int>_> collection2;
  mutex mutex3;
  mutex mutex2;
  atomic<unsigned_long> j3;
  atomic<unsigned_long> j2;
  size_t j1;
  Taskflow taskflow;
  size_t N;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> mybuffer;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff868;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff870;
  Taskflow *in_stack_fffffffffffff880;
  size_type in_stack_fffffffffffff888;
  Executor *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff890;
  Executor *this_00;
  Executor *this_01;
  char *__s;
  FlowBuilder *this_02;
  allocator<char> local_6e1;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>
  *in_stack_fffffffffffff920;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>
  *in_stack_fffffffffffff928;
  Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>
  *in_stack_fffffffffffff930;
  size_t in_stack_fffffffffffff938;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
  *in_stack_fffffffffffff940;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff958;
  size_t in_stack_fffffffffffff960;
  Executor *in_stack_fffffffffffff968;
  Task local_678;
  undefined1 local_669 [41];
  Task local_640;
  pointer local_638;
  undefined8 *local_630;
  undefined8 local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  Executor *local_610;
  pointer local_5d0;
  undefined8 *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  Executor *local_5a8;
  pointer local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  Executor *local_548;
  undefined8 local_330;
  undefined1 local_328 [24];
  undefined1 local_310 [24];
  undefined1 local_2f8 [40];
  undefined1 local_2d0 [40];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [296];
  _Elt_pointer local_170;
  FlowBuilder local_158 [42];
  Executor *local_8;
  
  object = (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
            *)(ulong)in_ESI;
  this_02 = local_158;
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff870._M_current,
             in_stack_fffffffffffff868._M_current);
  tf::Executor::Executor
            (in_stack_fffffffffffff968,in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x12bf1e);
  local_170 = (_Elt_pointer)0x64;
  __s = local_298 + 0x10f;
  std::allocator<int>::allocator((allocator<int> *)0x12bf3c);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff890,in_stack_fffffffffffff888,
             (allocator_type *)in_stack_fffffffffffff880);
  std::allocator<int>::~allocator((allocator<int> *)0x12bf62);
  this_01 = (Executor *)(local_298 + 0x110);
  local_298._256_8_ =
       std::vector<int,_std::allocator<int>_>::begin
                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff868._M_current);
  local_298._248_8_ =
       std::vector<int,_std::allocator<int>_>::end
                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff868._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,0);
  this_00 = local_8;
  std::allocator<std::array<int,_3UL>_>::allocator((allocator<std::array<int,_3UL>_> *)0x12bfc6);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)this_00,
             in_stack_fffffffffffff888,(allocator_type *)in_stack_fffffffffffff880);
  std::allocator<std::array<int,_3UL>_>::~allocator((allocator<std::array<int,_3UL>_> *)0x12bfec);
  for (local_298._208_8_ = (pointer)0x0; (ulong)local_298._208_8_ < (pointer)0x65;
      local_298._208_8_ =
           (long)&(((Line *)local_298._208_8_)->join_counter).super___atomic_base<unsigned_long>.
                  _M_i + 1) {
    tf::Taskflow::Taskflow((Taskflow *)this_00);
    local_298._0_8_ = (pointer)0x0;
    local_2a0 = 0;
    local_2a8 = 0;
    std::mutex::mutex((mutex *)0x12c047);
    std::mutex::mutex((mutex *)0x12c054);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12c061);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12c06e);
    local_330 = 1;
    local_568 = (pointer)local_298._208_8_;
    local_560 = local_298 + 0x110;
    local_558 = local_298;
    local_550 = local_298 + 0xe0;
    local_548 = local_8;
    this = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:908:38)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>
            *)in_stack_fffffffffffff870._M_current,
           (PipeType)((ulong)in_stack_fffffffffffff868._M_current >> 0x20),
           (anon_class_40_5_1f4a69ea_for__callable *)0x12c0f1);
    local_5d0 = (pointer)local_298._208_8_;
    local_5c8 = &local_2a0;
    local_5c0 = local_2d0;
    local_5b8 = local_310;
    local_5b0 = local_298 + 0xe0;
    local_5a8 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:920:40)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>
            *)in_stack_fffffffffffff870._M_current,
           (PipeType)((ulong)in_stack_fffffffffffff868._M_current >> 0x20),
           (anon_class_48_6_88ea5900_for__callable *)0x12c16d);
    local_638 = (pointer)local_298._208_8_;
    local_630 = &local_2a8;
    local_628 = local_2f8;
    local_620 = local_328;
    local_618 = local_298 + 0xe0;
    local_610 = local_8;
    tf::
    Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:931:40)>
    ::Pipe((Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>
            *)in_stack_fffffffffffff870._M_current,
           (PipeType)((ulong)in_stack_fffffffffffff868._M_current >> 0x20),
           (anon_class_48_6_88f8e8a1_for__callable *)0x12c1e9);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:908:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:920:40)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:931:40)>_>
    ::Pipeline(in_stack_fffffffffffff940,in_stack_fffffffffffff938,in_stack_fffffffffffff930,
               in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    tf::FlowBuilder::
    composed_of<tf::Pipeline<tf::Pipe<pipeline_3P_SPP(unsigned_long,unsigned_int)::__0>,tf::Pipe<pipeline_3P_SPP(unsigned_long,unsigned_int)::__1>,tf::Pipe<pipeline_3P_SPP(unsigned_long,unsigned_int)::__2>>>
              (this_02,object);
    in_stack_fffffffffffff880 = (Taskflow *)local_669;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_01);
    rhs = tf::Task::name((Task *)in_stack_fffffffffffff870._M_current,
                         (string *)in_stack_fffffffffffff868._M_current);
    tf::Task::Task(&local_640,rhs);
    std::__cxx11::string::~string((string *)(local_669 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_669);
    in_stack_fffffffffffff940 =
         (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
          *)local_298;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:942:34),_nullptr>
              (this_02,(anon_class_64_8_c807f005 *)object);
    in_stack_fffffffffffff870._M_current = (int *)&local_6e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_01);
    in_stack_fffffffffffff868._M_current =
         (int *)tf::Task::name(in_stack_fffffffffffff870._M_current,
                               in_stack_fffffffffffff868._M_current);
    tf::Task::Task(&local_678,(Task *)in_stack_fffffffffffff868._M_current);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff920);
    std::allocator<char>::~allocator(&local_6e1);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_fffffffffffff870._M_current,
               (Task *)in_stack_fffffffffffff868._M_current);
    tf::Executor::run_n<pipeline_3P_SPP(unsigned_long,unsigned_int)::__4>
              (this,in_stack_fffffffffffff880,(size_t)rhs,
               (anon_class_56_7_b7aa72e9 *)in_stack_fffffffffffff870._M_current);
    std::future<void>::get((future<void> *)in_stack_fffffffffffff880);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff870._M_current);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:908:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:920:40)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:931:40)>_>
    ::~Pipeline((Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
                 *)in_stack_fffffffffffff870._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880);
    tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffff870._M_current);
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
            ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
             in_stack_fffffffffffff880);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff880);
  tf::Executor::~Executor(this_01);
  return;
}

Assistant:

void pipeline_3P_SPP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 3>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::atomic<size_t> j3 = 0;
    std::mutex mutex2;
    std::mutex mutex3;
    std::vector<int> collection2;
    std::vector<int> collection3;
    size_t cnt = 1;

    tf::Pipeline pl(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1, &mybuffer, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        j1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j2, &mutex2, &collection2, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j2++ < N);
        //*pf.output() = *pf.input() + 1;
        {
          std::scoped_lock<std::mutex> lock(mutex2);
          REQUIRE(pf.token() % L == pf.line());
          mybuffer[pf.line()][pf.pipe()] = mybuffer[pf.line()][pf.pipe() - 1] + 1;
          collection2.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j3, &mutex3, &collection3, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j3++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex3);
          REQUIRE(pf.token() % L == pf.line());
          collection3.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline = taskflow.composed_of(pl).name("module_of_pipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);
      REQUIRE(j3 == N);
      REQUIRE(collection2.size() == N);
      REQUIRE(collection3.size() == N);

      std::sort(collection2.begin(), collection2.end());
      std::sort(collection3.begin(), collection3.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection2[i] == i + 1);
        REQUIRE(collection3[i] == i + 2);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    pipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = j3 = 0;
      collection2.clear();
      collection3.clear();
      for(size_t i = 0; i < mybuffer.size(); ++i){
        for(size_t j = 0; j < mybuffer[0].size(); ++j){
          mybuffer[i][j] = 0;
        }
      }

      cnt++;
    }).get();
  }
}